

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::compute_pca
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *axis_res,
          vec<16U,_float> *centroid_res,weighted_vec_array *vecs,vector<unsigned_int> *indices)

{
  uint uVar1;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *this_00;
  uint uVar2;
  uint *puVar3;
  float *pfVar4;
  row_vec *prVar5;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *in_RCX;
  vec<16U,_float> *in_RDX;
  vec<16U,_float> *in_RSI;
  vector<unsigned_int> *in_R8;
  float fVar6;
  double dVar7;
  vec<16U,_float> delta_axis;
  uint j;
  double sum;
  uint i_4;
  double max_sum;
  vec<16U,_float> x_3;
  uint iter;
  uint cMaxIterations;
  vec<16U,_float> prev_axis;
  uint i_3;
  vec<16U,_float> axis;
  uint y_2;
  uint x_2;
  uint y_1;
  uint x_1;
  uint y;
  uint x;
  vec<16U,_float> w;
  vec<16U,_float> v_1;
  weighted_vec *weighted_vec;
  uint i_2;
  matrix<16U,_16U,_float> covar;
  uint i_1;
  double one_over_total_weight;
  weighted_vec *v;
  uint i;
  double total_weight;
  vec<16U,_float> centroid;
  uint N;
  float in_stack_fffffffffffff91c;
  undefined4 in_stack_fffffffffffff920;
  float in_stack_fffffffffffff924;
  float in_stack_fffffffffffff928;
  float in_stack_fffffffffffff92c;
  float in_stack_fffffffffffff930;
  float in_stack_fffffffffffff934;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
  *in_stack_fffffffffffff938;
  vec<16U,_float> local_6a4;
  uint local_664;
  double local_660;
  uint local_654;
  double local_650;
  vec<16U,_float> local_644;
  uint local_604;
  undefined4 local_600;
  vec<16U,_float> local_5fc;
  uint local_5bc;
  vec<16U,_float> local_5b8;
  uint local_578;
  uint local_574;
  uint local_570;
  uint local_56c;
  uint local_568;
  uint local_564;
  vec<16U,_float> local_560;
  vec<16U,_float> local_520;
  weighted_vec *local_4e0;
  uint local_4d8;
  matrix<16U,_16U,_float> local_4d4;
  uint local_d4;
  double local_d0;
  vec<16U,_float> local_c8;
  weighted_vec *local_88;
  uint local_7c;
  double local_78;
  vec<16U,_float> local_6c;
  undefined4 local_2c;
  vector<unsigned_int> *local_28;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *local_20;
  vec<16U,_float> *local_18;
  vec<16U,_float> *local_10;
  
  local_2c = 0x10;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  vec<16U,_float>::vec
            ((vec<16U,_float> *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             in_stack_fffffffffffff91c);
  local_78 = 0.0;
  for (local_7c = 0; uVar1 = local_7c, uVar2 = vector<unsigned_int>::size(local_28),
      this_00 = local_20, uVar1 < uVar2; local_7c = local_7c + 1) {
    puVar3 = vector<unsigned_int>::operator[](local_28,local_7c);
    local_88 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
               operator[](this_00,*puVar3);
    crnlib::operator*((vec<16U,_float> *)
                      CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                      in_stack_fffffffffffff924);
    vec<16U,_float>::operator+=(&local_6c,&local_c8);
    local_78 = (double)local_88->m_weight + local_78;
  }
  if ((local_78 != 0.0) || (NAN(local_78))) {
    local_d0 = 1.0 / local_78;
    for (local_d4 = 0; local_d4 < 0x10; local_d4 = local_d4 + 1) {
      pfVar4 = vec<16U,_float>::operator[](&local_6c,local_d4);
      dVar7 = (double)*pfVar4 * local_d0;
      pfVar4 = vec<16U,_float>::operator[](&local_6c,local_d4);
      *pfVar4 = (float)dVar7;
    }
    matrix<16U,_16U,_float>::matrix
              ((matrix<16U,_16U,_float> *)
               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    matrix<16U,_16U,_float>::clear
              ((matrix<16U,_16U,_float> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    for (local_4d8 = 0; uVar1 = local_4d8, uVar2 = vector<unsigned_int>::size(local_28),
        uVar1 < uVar2; local_4d8 = local_4d8 + 1) {
      in_stack_fffffffffffff938 = local_20;
      puVar3 = vector<unsigned_int>::operator[](local_28,local_4d8);
      local_4e0 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
                  operator[](in_stack_fffffffffffff938,*puVar3);
      crnlib::operator-((vec<16U,_float> *)in_stack_fffffffffffff938,
                        (vec<16U,_float> *)
                        CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
      crnlib::operator*((vec<16U,_float> *)
                        CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                        in_stack_fffffffffffff924);
      for (local_564 = 0; local_564 < 0x10; local_564 = local_564 + 1) {
        for (local_568 = local_564; local_568 < 0x10; local_568 = local_568 + 1) {
          prVar5 = matrix<16U,_16U,_float>::operator[](&local_4d4,local_564);
          pfVar4 = vec<16U,_float>::operator[](prVar5,local_568);
          in_stack_fffffffffffff930 = *pfVar4;
          in_stack_fffffffffffff92c = vec<16U,_float>::operator[](&local_520,local_564);
          fVar6 = vec<16U,_float>::operator[](&local_560,local_568);
          in_stack_fffffffffffff934 = in_stack_fffffffffffff930 + in_stack_fffffffffffff92c * fVar6;
          prVar5 = matrix<16U,_16U,_float>::operator[](&local_4d4,local_564);
          pfVar4 = vec<16U,_float>::operator[](prVar5,local_568);
          *pfVar4 = in_stack_fffffffffffff934;
        }
      }
    }
    for (local_56c = 0; local_56c < 0x10; local_56c = local_56c + 1) {
      for (local_570 = local_56c; local_570 < 0x10; local_570 = local_570 + 1) {
        prVar5 = matrix<16U,_16U,_float>::operator[](&local_4d4,local_56c);
        pfVar4 = vec<16U,_float>::operator[](prVar5,local_570);
        in_stack_fffffffffffff928 = (float)((double)*pfVar4 * local_d0);
        prVar5 = matrix<16U,_16U,_float>::operator[](&local_4d4,local_56c);
        pfVar4 = vec<16U,_float>::operator[](prVar5,local_570);
        *pfVar4 = in_stack_fffffffffffff928;
      }
    }
    for (local_574 = 0; uVar2 = local_574, local_574 < 0xf; local_574 = local_574 + 1) {
      while (local_578 = uVar2 + 1, local_578 < 0x10) {
        prVar5 = matrix<16U,_16U,_float>::operator[](&local_4d4,local_574);
        pfVar4 = vec<16U,_float>::operator[](prVar5,local_578);
        fVar6 = *pfVar4;
        prVar5 = matrix<16U,_16U,_float>::operator[](&local_4d4,local_578);
        pfVar4 = vec<16U,_float>::operator[](prVar5,local_574);
        *pfVar4 = fVar6;
        uVar2 = local_578;
      }
    }
    vec<16U,_float>::vec(&local_5b8);
    for (local_5bc = 0; local_5bc < 0x10; local_5bc = local_5bc + 1) {
      fVar6 = math::lerp<float,float>(0.75,1.25,(float)local_5bc * 0.06666667);
      pfVar4 = vec<16U,_float>::operator[](&local_5b8,local_5bc);
      *pfVar4 = fVar6;
    }
    vec<16U,_float>::vec(&local_5fc,&local_5b8);
    local_600 = 10;
    for (local_604 = 0; local_604 < 10; local_604 = local_604 + 1) {
      vec<16U,_float>::vec(&local_644);
      local_650 = 0.0;
      for (local_654 = 0; local_654 < 0x10; local_654 = local_654 + 1) {
        local_660 = 0.0;
        for (local_664 = 0; local_664 < 0x10; local_664 = local_664 + 1) {
          pfVar4 = vec<16U,_float>::operator[](&local_5b8,local_664);
          fVar6 = *pfVar4;
          prVar5 = matrix<16U,_16U,_float>::operator[](&local_4d4,local_654);
          pfVar4 = vec<16U,_float>::operator[](prVar5,local_664);
          local_660 = (double)(fVar6 * *pfVar4) + local_660;
        }
        fVar6 = (float)local_660;
        pfVar4 = vec<16U,_float>::operator[](&local_644,local_654);
        *pfVar4 = fVar6;
        local_650 = math::maximum<double>
                              (local_650,(double)((ulong)local_660 & (ulong)DAT_00248210));
      }
      if ((local_650 != 0.0) || (NAN(local_650))) {
        vec<16U,_float>::operator*=(&local_644,(float)(1.0 / local_650));
      }
      crnlib::operator-((vec<16U,_float> *)in_stack_fffffffffffff938,
                        (vec<16U,_float> *)
                        CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
      vec<16U,_float>::operator=(&local_5fc,&local_5b8);
      vec<16U,_float>::operator=(&local_5b8,&local_644);
      fVar6 = vec<16U,_float>::norm(&local_6a4);
      if (fVar6 < 0.0025) break;
    }
    vec<16U,_float>::normalize
              ((vec<16U,_float> *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
               (vec<16U,_float> *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
    vec<16U,_float>::operator=(local_10,&local_5b8);
    vec<16U,_float>::operator=(local_18,&local_6c);
  }
  else {
    vec<16U,_float>::clear((vec<16U,_float> *)0x186e49);
    vec<16U,_float>::operator=(local_18,&local_6c);
  }
  return;
}

Assistant:

void compute_pca(VectorType& axis_res, VectorType& centroid_res, const weighted_vec_array& vecs, const vector<uint>& indices) {
    const uint N = VectorType::num_elements;

    VectorType centroid(0.0f);
    double total_weight = 0.0f;
    for (uint i = 0; i < indices.size(); i++) {
      const weighted_vec& v = vecs[indices[i]];
      centroid += v.m_vec * static_cast<float>(v.m_weight);
      total_weight += v.m_weight;
    }

    if (total_weight == 0.0f) {
      axis_res.clear();
      centroid_res = centroid;
      return;
    }

    double one_over_total_weight = 1.0f / total_weight;
    for (uint i = 0; i < N; i++)
      centroid[i] = static_cast<float>(centroid[i] * one_over_total_weight);

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < indices.size(); i++) {
      const weighted_vec& weighted_vec = vecs[indices[i]];

      const VectorType v(weighted_vec.m_vec - centroid);
      const VectorType w(v * static_cast<float>(weighted_vec.m_weight));

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] = static_cast<float>(covar[x][y] * one_over_total_weight);

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;
    for (uint i = 0; i < N; i++)
      axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / (N - 1)));

    VectorType prev_axis(axis);

    const uint cMaxIterations = 10;
    for (uint iter = 0; iter < cMaxIterations; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    axis_res = axis;
    centroid_res = centroid;
  }